

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<DataStream,prevector<8u,int,unsigned_int,int>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          prevector<8U,_int,_unsigned_int,_int> *v)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  value_type_conflict2 *elem;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = v->_size;
  uVar2 = uVar3 - 9;
  if (uVar3 < 9) {
    uVar2 = uVar3;
  }
  WriteCompactSize<DataStream>(s,(ulong)uVar2);
  uVar3 = v->_size;
  if (8 < uVar3) {
    v = (prevector<8U,_int,_unsigned_int,_int> *)(v->_union).indirect_contents.indirect;
    uVar3 = uVar3 - 9;
  }
  for (lVar4 = (long)(int)uVar3 << 2; lVar4 != 0; lVar4 = lVar4 + -4) {
    DefaultFormatter::Ser<DataStream,int>(s,(int *)v);
    v = (prevector<8U,_int,_unsigned_int,_int> *)((v->_union).direct + 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }